

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_cursor.cxx
# Opt level: O1

void __thiscall Fl_Window::cursor(Fl_Window *this,Fl_RGB_Image *image,int hotx,int hoty)

{
  Fl_Window *pFVar1;
  int iVar2;
  Fl_Window *this_00;
  Fl_Window *this_01;
  
  pFVar1 = this;
  do {
    do {
      this_01 = pFVar1;
      this_00 = this;
      this = Fl_Widget::window((Fl_Widget *)this_00);
      pFVar1 = this_01;
    } while (this != (Fl_Window *)0x0);
    this = this_00;
    pFVar1 = this_00;
  } while (this_00 != this_01);
  if ((this_01->i != (Fl_X *)0x0) &&
     (iVar2 = Fl_X::set_cursor(this_01->i,image,hotx,hoty), iVar2 == 0)) {
    cursor(this_01,FL_CURSOR_DEFAULT);
    return;
  }
  return;
}

Assistant:

void Fl_Window::cursor(const Fl_RGB_Image *image, int hotx, int hoty) {
  int ret;

  // the cursor must be set for the top level window, not for subwindows
  Fl_Window *w = window(), *toplevel = this;

  while (w) {
    toplevel = w;
    w = w->window();
  }

  if (toplevel != this) {
    toplevel->cursor(image, hotx, hoty);
    return;
  }

  if (!i)
    return;

  ret = i->set_cursor(image, hotx, hoty);
  if (ret)
    return;

  cursor(FL_CURSOR_DEFAULT);
}